

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O3

uint __thiscall
tchecker::
variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::id(variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     *this,string *name)

{
  invalid_argument *this_00;
  const_value_map_iterator_t it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  pointer local_28;
  
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&local_28,(key_type *)&(this->_index)._value_map);
  if (local_28 ==
      (this->_index)._value_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
      (this->_index)._value_map.m_flat_tree.m_data.m_seq.m_holder.m_size) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_48,"unknown variable ",name);
    std::invalid_argument::invalid_argument(this_00,(string *)&bStack_48);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_28 != (pointer)0x0) {
    return local_28->second;
  }
  __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                "reference boost::container::vec_iterator<std::pair<std::basic_string<char>, unsigned int> *, true>::operator*() const [Pointer = std::pair<std::basic_string<char>, unsigned int> *, IsConst = true]"
               );
}

Assistant:

inline ID id(std::string const & name) const
  {
    auto it = _index.find_value(name);
    if (it == _index.end_value_map())
      throw std::invalid_argument("unknown variable " + name);
    return _index.key(*it);
  }